

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O0

bool __thiscall ON_AerialPhotoCameraPosition::OrientationIsSet(ON_AerialPhotoCameraPosition *this)

{
  bool bVar1;
  bool local_11;
  ON_AerialPhotoCameraPosition *this_local;
  
  local_11 = false;
  if ((this->m_status & 2) != 0) {
    bVar1 = ON_3dVector::IsValid(&this->m_orientation_angles_radians);
    local_11 = false;
    if (bVar1) {
      bVar1 = ON_3dVector::IsValid(&this->m_orientation_angles_degrees);
      local_11 = false;
      if (bVar1) {
        bVar1 = ON_3dVector::IsValid(&this->m_orientation_right);
        local_11 = false;
        if (bVar1) {
          bVar1 = ON_3dVector::IsValid(&this->m_orientation_up);
          local_11 = false;
          if (bVar1) {
            bVar1 = ON_3dVector::IsValid(&this->m_orientation_direction);
            local_11 = false;
            if (bVar1) {
              local_11 = ON_Xform::IsValid(&this->m_orientation_rotation);
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool ON_AerialPhotoCameraPosition::OrientationIsSet() const
{
  return ( 0 != (m_status & 2) 
           && m_orientation_angles_radians.IsValid() 
           && m_orientation_angles_degrees.IsValid()
           && m_orientation_right.IsValid()
           && m_orientation_up.IsValid()
           && m_orientation_direction.IsValid()
           && m_orientation_rotation.IsValid()
         );
}